

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall
pfederc::EnumExpr::EnumExpr
          (EnumExpr *this,Lexer *lexer,Position *pos,Token *tokId,TemplateDecls *templs,
          vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
          *constructors)

{
  pointer puVar1;
  tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> tVar2;
  pointer ptVar3;
  pointer puVar4;
  size_t sVar5;
  iterator __begin1;
  pointer puVar6;
  pointer ptVar7;
  pointer puVar8;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_ENUM;
  sVar5 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar5;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__EnumExpr_00127878;
  this->tokId = tokId;
  puVar6 = (templs->
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar6;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ptVar7 = (constructors->
           super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->constructors).
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (constructors->
       super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->constructors).
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ptVar7;
  (this->constructors).
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (constructors->
       super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (constructors->
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (constructors->
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (constructors->
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->tokId != (Token *)0x0) {
    puVar1 = (this->templs).
             super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->templs).
                  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      tVar2.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
            &(((puVar6->_M_t).
               super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
               .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl)->expr)._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
      if (tVar2.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
          (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
        *(EnumExpr **)
         ((long)tVar2.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8) = this;
      }
    }
    ptVar3 = (this->constructors).
             super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ptVar7 = (this->constructors).
                  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar7 != ptVar3; ptVar7 = ptVar7 + 1)
    {
      puVar4 = *(pointer *)
                ((long)&(ptVar7->
                        super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                        ).
                        super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                        .
                        super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
                        ._M_head_impl.
                        super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (puVar8 = (ptVar7->
                    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                    ).
                    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                    .
                    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1
          ) {
        ((puVar8->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->parent = &this->super_Expr;
      }
    }
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x1f6,
                "pfederc::EnumExpr::EnumExpr(const Lexer &, const Position &, const Token *, TemplateDecls &&, std::vector<EnumConstructor> &&)"
               );
}

Assistant:

EnumExpr::EnumExpr(const Lexer &lexer, const Position &pos,
    const Token *tokId,
    TemplateDecls &&templs,
    std::vector<EnumConstructor> &&constructors) noexcept
    : Expr(lexer, ExprType::EXPR_ENUM, pos), tokId{tokId},
      templs(std::move(templs)), constructors(std::move(constructors)) {
  assert(this->tokId);

  _setTemplateParents(this->templs, this);

  for (auto &construct : this->constructors) {
    _setParents(std::get<1>(construct), this);
  }
}